

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::ensure(JSPrinter *this,int safety)

{
  ulong uVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  size_t *psVar3;
  JSPrinter *this_00;
  ulong uVar4;
  
  psVar3 = (size_t *)CONCAT44(in_register_00000034,safety);
  if (this->size < this->used + (long)safety) {
    uVar1 = this->size * 2;
    uVar4 = 0x400;
    if (0x400 < uVar1) {
      uVar4 = uVar1;
    }
    this_00 = (JSPrinter *)(uVar4 + (long)safety);
    this->size = (size_t)this_00;
    if (this->buffer == (char *)0x0) {
      pcVar2 = (char *)malloc((size_t)this_00);
      this->buffer = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_005e0ac0;
    }
    else {
      pcVar2 = (char *)realloc(this->buffer,(size_t)this_00);
      if (pcVar2 == (char *)0x0) {
        psVar3 = &this->size;
        ensure();
LAB_005e0ac0:
        ensure(this_00);
        if ((int)*psVar3 == 0) {
          emit(this_00,(char *)psVar3[2]);
          return;
        }
        __assert_fail("isString()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0xec,"const char *cashew::Value::getCString()");
      }
      this->buffer = pcVar2;
    }
  }
  return;
}

Assistant:

void ensure(int safety = 100) {
    if (size >= used + safety) {
      return;
    }
    size = std::max((size_t)1024, size * 2) + safety;
    if (!buffer) {
      buffer = (char*)malloc(size);
      if (!buffer) {
        errv("Out of memory allocating %zd bytes for output buffer!", size);
        abort();
      }
    } else {
      char* buf = (char*)realloc(buffer, size);
      if (!buf) {
        free(buffer);
        errv("Out of memory allocating %zd bytes for output buffer!", size);
        abort();
      }
      buffer = buf;
    }
  }